

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::CalcConstraintsPositionError
               (Model *model,VectorNd *Q,ConstraintSet *CS,VectorNd *err,bool update_kinematics)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  lVar3 = *(long *)(CS + 200);
  if (*(long *)(CS + 0xd0) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 0x10);
      (**(code **)(*plVar1 + 0x18))(0,plVar1,model,Q,err,CS + 0x620,update_kinematics);
      lVar3 = *(long *)(CS + 200);
      bVar2 = uVar5 < (ulong)(*(long *)(CS + 0xd0) - lVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsPositionError (
  Model& model,
  const Math::VectorNd &Q,
  ConstraintSet &CS,
  Math::VectorNd& err,
  bool update_kinematics
)
{
  assert(err.size() == CS.size());

  if(update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcPositionError(model,0,Q,err, CS.cache,
                                         update_kinematics);
  }
}